

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::get_cap_name(string *__return_storage_ptr__,t_dart_generator *this,string *name)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  iVar2 = toupper((int)*pcVar1);
  *pcVar1 = (char)iVar2;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::get_cap_name(std::string name) {
  name[0] = toupper(name[0]);
  return name;
}